

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

void __thiscall
brynet::net::DataSocket::sendInLoop
          (DataSocket *this,PACKET_PTR *packet,PACKED_SENDED_CALLBACK *callback)

{
  bool bVar1;
  element_type *peVar2;
  value_type local_60;
  size_t local_28;
  size_type len;
  PACKED_SENDED_CALLBACK *callback_local;
  PACKET_PTR *packet_local;
  DataSocket *this_local;
  
  len = (size_type)callback;
  callback_local = (PACKED_SENDED_CALLBACK *)packet;
  packet_local = (PACKET_PTR *)this;
  peVar2 = std::
           __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->mEventLoop);
  bVar1 = EventLoop::isInLoopThread(peVar2);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mEventLoop);
    bVar1 = EventLoop::isInLoopThread(peVar2);
    if (bVar1) {
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)callback_local);
      local_28 = std::__cxx11::string::size();
      std::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      shared_ptr(&local_60.data,
                 (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)callback_local);
      local_60.left = local_28;
      std::function<void_()>::function(&local_60.mCompleteCallback,(function<void_()> *)len);
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::push_back(&this->mSendList,&local_60);
      pending_packet::~pending_packet(&local_60);
      runAfterFlush(this);
    }
    return;
  }
  __assert_fail("mEventLoop->isInLoopThread()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                ,0x89,
                "void brynet::net::DataSocket::sendInLoop(const PACKET_PTR &, const PACKED_SENDED_CALLBACK &)"
               );
}

Assistant:

void DataSocket::sendInLoop(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    assert(mEventLoop->isInLoopThread());
    if (mEventLoop->isInLoopThread())
    {
        auto len = packet->size();
        mSendList.push_back({ packet, len, callback });
        runAfterFlush();
    }
}